

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ternary_executor.hpp
# Opt level: O3

idx_t duckdb::TernaryExecutor::
      SelectLoop<float,float,float,duckdb::UpperInclusiveBetweenOperator,false,true,true>
                (float *adata,float *bdata,float *cdata,SelectionVector *result_sel,idx_t count,
                SelectionVector *asel,SelectionVector *bsel,SelectionVector *csel,
                ValidityMask *avalidity,ValidityMask *bvalidity,ValidityMask *cvalidity,
                SelectionVector *true_sel,SelectionVector *false_sel)

{
  unsigned_long *puVar1;
  bool bVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  long lVar6;
  ulong uVar7;
  idx_t iVar8;
  ulong uVar9;
  float local_64;
  float local_60;
  float local_5c;
  SelectionVector *local_58;
  ulong local_50;
  float *local_48;
  float *local_40;
  float *local_38;
  
  if (count == 0) {
    iVar8 = 0;
  }
  else {
    iVar8 = 0;
    lVar6 = 0;
    uVar9 = 0;
    local_58 = result_sel;
    local_50 = count;
    local_48 = adata;
    local_40 = bdata;
    local_38 = cdata;
    do {
      uVar5 = uVar9;
      if (result_sel->sel_vector != (sel_t *)0x0) {
        uVar5 = (ulong)result_sel->sel_vector[uVar9];
      }
      uVar3 = uVar9;
      if (asel->sel_vector != (sel_t *)0x0) {
        uVar3 = (ulong)asel->sel_vector[uVar9];
      }
      uVar7 = uVar9;
      if (bsel->sel_vector != (sel_t *)0x0) {
        uVar7 = (ulong)bsel->sel_vector[uVar9];
      }
      uVar4 = uVar9;
      if (csel->sel_vector != (sel_t *)0x0) {
        uVar4 = (ulong)csel->sel_vector[uVar9];
      }
      puVar1 = (avalidity->super_TemplatedValidityMask<unsigned_long>).validity_mask;
      if ((((puVar1 == (unsigned_long *)0x0) || ((puVar1[uVar3 >> 6] >> (uVar3 & 0x3f) & 1) != 0))
          && ((puVar1 = (bvalidity->super_TemplatedValidityMask<unsigned_long>).validity_mask,
              puVar1 == (unsigned_long *)0x0 || ((puVar1[uVar7 >> 6] >> (uVar7 & 0x3f) & 1) != 0))))
         && ((puVar1 = (cvalidity->super_TemplatedValidityMask<unsigned_long>).validity_mask,
             puVar1 == (unsigned_long *)0x0 || ((puVar1[uVar4 >> 6] >> (uVar4 & 0x3f) & 1) != 0))))
      {
        local_5c = local_48[uVar3];
        local_60 = local_40[uVar7];
        local_64 = local_38[uVar4];
        bVar2 = GreaterThan::Operation<float>(&local_5c,&local_60);
        if (bVar2) {
          bVar2 = GreaterThan::Operation<float>(&local_5c,&local_64);
          bVar2 = !bVar2;
          result_sel = local_58;
          count = local_50;
        }
        else {
          bVar2 = false;
          result_sel = local_58;
          count = local_50;
        }
      }
      else {
        bVar2 = false;
      }
      true_sel->sel_vector[iVar8] = (sel_t)uVar5;
      iVar8 = iVar8 + bVar2;
      false_sel->sel_vector[lVar6] = (sel_t)uVar5;
      lVar6 = lVar6 + (ulong)(bVar2 ^ 1);
      uVar9 = uVar9 + 1;
    } while (count != uVar9);
  }
  return iVar8;
}

Assistant:

static inline idx_t SelectLoop(const A_TYPE *__restrict adata, const B_TYPE *__restrict bdata,
	                               const C_TYPE *__restrict cdata, const SelectionVector *result_sel, idx_t count,
	                               const SelectionVector &asel, const SelectionVector &bsel,
	                               const SelectionVector &csel, ValidityMask &avalidity, ValidityMask &bvalidity,
	                               ValidityMask &cvalidity, SelectionVector *true_sel, SelectionVector *false_sel) {
		idx_t true_count = 0, false_count = 0;
		for (idx_t i = 0; i < count; i++) {
			auto result_idx = result_sel->get_index(i);
			auto aidx = asel.get_index(i);
			auto bidx = bsel.get_index(i);
			auto cidx = csel.get_index(i);
			bool comparison_result =
			    (NO_NULL || (avalidity.RowIsValid(aidx) && bvalidity.RowIsValid(bidx) && cvalidity.RowIsValid(cidx))) &&
			    OP::Operation(adata[aidx], bdata[bidx], cdata[cidx]);
			if (HAS_TRUE_SEL) {
				true_sel->set_index(true_count, result_idx);
				true_count += comparison_result;
			}
			if (HAS_FALSE_SEL) {
				false_sel->set_index(false_count, result_idx);
				false_count += !comparison_result;
			}
		}
		if (HAS_TRUE_SEL) {
			return true_count;
		} else {
			return count - false_count;
		}
	}